

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O2

void __thiscall
henson::Coroutine<henson::PythonPuppet>::proceed(Coroutine<henson::PythonPuppet> *this)

{
  time_type *ptVar1;
  time_type tVar2;
  
  tVar2 = get_time();
  (this->super_BaseCoroutine).start_time_ = tVar2;
  coro_transfer(&this->from_,&this->to_);
  tVar2 = get_time();
  ptVar1 = &(this->super_BaseCoroutine).total_time_;
  *ptVar1 = *ptVar1 + (tVar2 - (this->super_BaseCoroutine).start_time_);
  return;
}

Assistant:

void                proceed()
    {
        start_time_ = get_time();
#ifdef USE_BOOST
        to_ = to_.resume();
#else
        coro_transfer(&from_, &to_);
#endif
        time_type diff = get_time() - start_time_;
        total_time_ += diff;
    }